

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O3

void anon_unknown.dwarf_4ac6::Test_TemplateDictionary_SetEscapedFormattedValue::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  bool bVar5;
  undefined8 extraout_RAX;
  undefined8 in_R8;
  undefined8 in_R9;
  TemplateDictionaryPeer peer;
  TemplateDictionary dict;
  TemplateDictionaryPeer local_168;
  char *local_160;
  undefined8 uStack_158;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined8 uStack_148;
  char *local_140;
  undefined8 uStack_138;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined8 uStack_128;
  char *local_120;
  undefined8 uStack_118;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined8 uStack_108;
  char *local_100;
  undefined8 uStack_f8;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined8 uStack_e8;
  TemplateString local_e0;
  TemplateString local_c0;
  TemplateDictionary local_a0 [112];
  
  local_e0.ptr_ = "test_SetEscapedFormattedValue";
  local_e0.length_ = 0x1d;
  local_e0.is_immutable_ = true;
  local_e0.id_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary(local_a0,&local_e0,(UnsafeArena *)0x0);
  local_100 = "HTML";
  uStack_f8 = 4;
  local_f0 = CONCAT31(local_f0._1_3_,1);
  uStack_e8 = 0;
  TVar1.length_._0_4_ = 4;
  TVar1.ptr_ = "HTML";
  TVar1.length_._4_4_ = 0;
  TVar1._16_4_ = local_f0;
  TVar1._20_4_ = uStack_ec;
  TVar1.id_ = 0;
  local_168.dict_ = local_a0;
  ctemplate::TemplateDictionary::SetEscapedFormattedValue
            (TVar1,(TemplateModifier *)local_a0,(char *)&ctemplate::html_escape,0x55555555,
             "This is <%s> #%.4f","a & b",in_R8,in_R9);
  local_120 = "PRE";
  uStack_118 = 3;
  local_110 = CONCAT31(local_110._1_3_,1);
  uStack_108 = 0;
  TVar2.length_._0_4_ = 3;
  TVar2.ptr_ = "PRE";
  TVar2.length_._4_4_ = 0;
  TVar2._16_4_ = local_110;
  TVar2._20_4_ = uStack_10c;
  TVar2.id_ = 0;
  ctemplate::TemplateDictionary::SetEscapedFormattedValue
            (TVar2,(TemplateModifier *)local_a0,(char *)&ctemplate::pre_escape,0x55555555,
             "if %s x = %.4f;","(a < 1 && b > 2)\n\t",in_R8,in_R9);
  local_140 = "URL";
  uStack_138 = 3;
  local_130 = CONCAT31(local_130._1_3_,1);
  uStack_128 = 0;
  TVar3.length_._0_4_ = 3;
  TVar3.ptr_ = "URL";
  TVar3.length_._4_4_ = 0;
  TVar3._16_4_ = local_130;
  TVar3._20_4_ = uStack_12c;
  TVar3.id_ = 0;
  ctemplate::TemplateDictionary::SetEscapedFormattedValue
            (TVar3,(TemplateModifier *)local_a0,(char *)&ctemplate::url_query_escape,"pageviews-%s",
             "r?egex",in_R8,in_R9);
  local_160 = "XML";
  uStack_158 = 3;
  local_150 = CONCAT31(local_150._1_3_,1);
  uStack_148 = 0;
  TVar4.length_._0_4_ = 3;
  TVar4.ptr_ = "XML";
  TVar4.length_._4_4_ = 0;
  TVar4._16_4_ = local_150;
  TVar4._20_4_ = uStack_14c;
  TVar4.id_ = 0;
  ctemplate::TemplateDictionary::SetEscapedFormattedValue
            (TVar4,(TemplateModifier *)local_a0,(char *)&ctemplate::xml_escape,"This&is%s -- ok?",
             "just&",in_R8,in_R9);
  local_e0.ptr_ = "HTML";
  local_e0.length_ = 4;
  local_e0.is_immutable_ = true;
  local_e0.id_ = 0;
  local_c0.ptr_ = "This is &lt;a &amp; b&gt; #0.3333";
  local_c0.length_ = 0x21;
  local_c0.is_immutable_ = true;
  local_c0.id_ = 0;
  bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_168,&local_e0,&local_c0);
  if (bVar5) {
    local_e0.ptr_ = "PRE";
    local_e0.length_ = 3;
    local_e0.is_immutable_ = true;
    local_e0.id_ = 0;
    local_c0.ptr_ = "if (a &lt; 1 &amp;&amp; b &gt; 2)\n\t x = 0.3333;";
    local_c0.length_ = 0x2f;
    local_c0.is_immutable_ = true;
    local_c0.id_ = 0;
    bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_168,&local_e0,&local_c0);
    if (!bVar5) goto LAB_0010c758;
    local_e0.ptr_ = "URL";
    local_e0.length_ = 3;
    local_e0.is_immutable_ = true;
    local_e0.id_ = 0;
    local_c0.ptr_ = "pageviews-r%3Fegex";
    local_c0.length_ = 0x12;
    local_c0.is_immutable_ = true;
    local_c0.id_ = 0;
    bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_168,&local_e0,&local_c0);
    if (bVar5) {
      local_e0.ptr_ = "XML";
      local_e0.length_ = 3;
      local_e0.is_immutable_ = true;
      local_e0.id_ = 0;
      local_c0.ptr_ = "This&amp;isjust&amp; -- ok?";
      local_c0.length_ = 0x1b;
      local_c0.is_immutable_ = true;
      local_c0.id_ = 0;
      bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_168,&local_e0,&local_c0);
      if (bVar5) {
        ctemplate::TemplateDictionary::~TemplateDictionary(local_a0);
        return;
      }
      goto LAB_0010c762;
    }
  }
  else {
    _GLOBAL__N_1::Test_TemplateDictionary_SetEscapedFormattedValue::Run();
LAB_0010c758:
    _GLOBAL__N_1::Test_TemplateDictionary_SetEscapedFormattedValue::Run();
  }
  _GLOBAL__N_1::Test_TemplateDictionary_SetEscapedFormattedValue::Run();
LAB_0010c762:
  _GLOBAL__N_1::Test_TemplateDictionary_SetEscapedFormattedValue::Run();
  ctemplate::TemplateDictionary::~TemplateDictionary(local_a0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(TemplateDictionary, SetValueWithoutCopy) {
  UnsafeArena arena(100);
  TemplateDictionary dict("Test arena", &arena);

  char value[32];
  snprintf(value, sizeof(value), "%s", "value");

  const void* const ptr = arena.Alloc(0);
  dict.SetValueWithoutCopy("key", value);
  // We shouldn't have copied the value string.
  EXPECT_EQ(ptr, arena.Alloc(0));

  TemplateDictionaryPeer peer(&dict);
  EXPECT_TRUE(peer.ValueIs("key", "value"));
  // If our content changes, so does what's in the dictionary -- but
  // only the contents of the buffer, not its length!
  snprintf(value, sizeof(value), "%s", "not_value");
  EXPECT_TRUE(peer.ValueIs("key", "not_v"));   // sizeof("not_v") == sizeof("value")
}